

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O0

void __thiscall xmrig::DaemonClient::retry(DaemonClient *this)

{
  Timer *in_RDI;
  SocketState in_stack_0000000c;
  uint64_t in_stack_ffffffffffffffe8;
  
  in_RDI[2].m_listener = (ITimerListener *)((long)&(in_RDI[2].m_listener)->_vptr_ITimerListener + 1)
  ;
  (*(in_RDI[1].m_listener)->_vptr_ITimerListener[2])
            (in_RDI[1].m_listener,in_RDI,(ulong)in_RDI[2].m_listener & 0xffffffff);
  if (in_RDI[2].m_listener != (ITimerListener *)0xffffffffffffffff) {
    if (*(int *)&in_RDI[0x1e].m_timer == 3) {
      setState(this,in_stack_0000000c);
    }
    Timer::stop((Timer *)0x1eaffb);
    Timer::start(in_RDI,in_stack_ffffffffffffffe8,0x1eb017);
  }
  return;
}

Assistant:

void xmrig::DaemonClient::retry()
{
    m_failures++;
    m_listener->onClose(this, static_cast<int>(m_failures));

    if (m_failures == -1) {
        return;
    }

    if (m_state == ConnectedState) {
        setState(ConnectingState);
    }

    m_timer->stop();
    m_timer->start(m_retryPause, 0);
}